

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall PrintVisitor::visit(PrintVisitor *this,UnaryNode *node)

{
  ExpressionNode *pEVar1;
  ostream *poVar2;
  mapped_type *pmVar3;
  PrintVisitor visitor;
  string local_40;
  
  poVar2 = this->stream_;
  indent_abi_cxx11_(&local_40,this);
  poVar2 = std::operator<<(poVar2,(string *)&local_40);
  poVar2 = std::operator<<(poVar2,"Unary: ");
  pmVar3 = std::__detail::
           _Map_base<UnaryOperator,_std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<UnaryOperator>,_std::hash<UnaryOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<UnaryOperator,_std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_UnaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<UnaryOperator>,_std::hash<UnaryOperator>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&UnaryOperationNames_abi_cxx11_,&node->unaryOperator_);
  poVar2 = std::operator<<(poVar2,(string *)pmVar3);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&local_40);
  local_40._M_string_length = (size_type)this->stream_;
  local_40.field_2._M_allocated_capacity._0_4_ = this->indentation_ + 1;
  local_40._M_dataplus._M_p = (pointer)&PTR__Visitor_00148d30;
  pEVar1 = (node->term_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_40);
  return;
}

Assistant:

void PrintVisitor::visit(const UnaryNode& node)
{
  stream_ << indent() << "Unary: " 
    << UnaryOperationNames.at(node.getOperation()) << "\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  node.getTerm().accept(visitor);
}